

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_test.cc
# Opt level: O0

int main(void)

{
  byte bVar1;
  int iVar2;
  ConcreteAggregate *this;
  undefined4 extraout_var;
  int local_38;
  int i;
  int value;
  Iterator *iterator;
  ConcreteAggregate *list;
  long *plVar3;
  
  this = (ConcreteAggregate *)operator_new(0x18);
  ConcreteAggregate::ConcreteAggregate(this,5);
  iVar2 = (**(this->super_Aggregate)._vptr_Aggregate)();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  local_38 = 0;
  while( true ) {
    bVar1 = (**(code **)(*plVar3 + 0x10))();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    iVar2 = (**(code **)(*plVar3 + 0x18))();
    if (iVar2 != local_38) {
      __assert_fail("value == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/iterator_test.cc"
                    ,0xe,"int main()");
    }
    local_38 = local_38 + 1;
    (**(code **)(*plVar3 + 8))();
  }
  (**(code **)*plVar3)();
  iVar2 = (**(code **)(*plVar3 + 0x18))();
  if (iVar2 == 0) {
    return 0;
  }
  __assert_fail("value == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/iterator_test.cc"
                ,0x15,"int main()");
}

Assistant:

int main() {
  ConcreteAggregate* list = new ConcreteAggregate(5);
  Iterator* iterator = list->createIterator();
  int value;

  for (int i = 0; !iterator->isDone(); iterator->next()) {
    value = iterator->currentItem();
    assert(value == i);
    i++;
  }

  iterator->first();

  value = iterator->currentItem();
  assert(value == 0);
}